

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void Json::stream(Value *jv,write_t *write)

{
  function<void_(const_void_*,_unsigned_long)> fStack_38;
  
  std::function<void_(const_void_*,_unsigned_long)>::function(&fStack_38,write);
  detail::write_value(&fStack_38,jv);
  beast::unit_test::std::_Function_base::~_Function_base((_Function_base *)&fStack_38);
  std::function<void_(const_void_*,_unsigned_long)>::operator()(write,"\n",1);
  return;
}

Assistant:

void
stream (Json::Value const& jv, write_t write)
{
    detail::write_value(write, jv);
    write("\n", 1);
}